

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

void __thiscall
ctemplate::CssUrlEscape::Modify
          (CssUrlEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char cVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  
  sVar3 = 0;
  do {
    if (inlen == sVar3) {
      return;
    }
    cVar1 = in[sVar3];
    switch(cVar1) {
    case '\"':
      pcVar2 = "%22";
      break;
    case '#':
    case '$':
    case '%':
    case '&':
switchD_0012e940_caseD_23:
      (*out->_vptr_ExpandEmitter[2])(out,(ulong)(uint)(int)cVar1);
      goto LAB_0012e9bd;
    case '\'':
      pcVar2 = "%27";
      break;
    case '(':
      pcVar2 = "%28";
      break;
    case ')':
      pcVar2 = "%29";
      break;
    case '*':
      pcVar2 = "%2A";
      break;
    default:
      if (cVar1 == '\\') {
        pcVar2 = "%5C";
      }
      else if (cVar1 == '\r') {
        pcVar2 = "%0D";
      }
      else if (cVar1 == '<') {
        pcVar2 = "%3C";
      }
      else if (cVar1 == '>') {
        pcVar2 = "%3E";
      }
      else {
        if (cVar1 != '\n') goto switchD_0012e940_caseD_23;
        pcVar2 = "%0A";
      }
    }
    (*out->_vptr_ExpandEmitter[5])(out,pcVar2,3);
LAB_0012e9bd:
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

void CssUrlEscape::Modify(const char* in, size_t inlen,
                          const PerExpandData*,
                          ExpandEmitter* out, const string& arg) const {
  for (size_t i = 0; i < inlen; ++i) {
    char c = in[i];
    switch (c) {
      case '\n': APPEND("%0A"); break;
      case '\r': APPEND("%0D"); break;
      case '"':  APPEND("%22"); break;
      case '\'': APPEND("%27"); break;
      case '(':  APPEND("%28"); break;
      case ')':  APPEND("%29"); break;
      case '*':  APPEND("%2A"); break;
      case '<':  APPEND("%3C"); break;
      case '>':  APPEND("%3E"); break;
      case '\\': APPEND("%5C"); break;
      default: out->Emit(c); break;
    }
  }
}